

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool ON_IsOrthogonalFrame(ON_2dVector *X,ON_2dVector *Y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double x;
  double ly;
  double lx;
  ON_2dVector *Y_local;
  ON_2dVector *X_local;
  
  dVar1 = ON_2dVector::Length(X);
  dVar2 = ON_2dVector::Length(Y);
  if (1.490116119385e-08 < dVar1) {
    if (1.490116119385e-08 < dVar2) {
      dVar3 = ON_DotProduct(X,Y);
      if (ABS(dVar3 * (1.0 / dVar1) * (1.0 / dVar2)) <= 1.490116119385e-08) {
        X_local._7_1_ = true;
      }
      else {
        X_local._7_1_ = false;
      }
    }
    else {
      X_local._7_1_ = false;
    }
  }
  else {
    X_local._7_1_ = false;
  }
  return X_local._7_1_;
}

Assistant:

bool ON_IsOrthogonalFrame( const ON_2dVector& X,  const ON_2dVector& Y )
{
  // returns true if X, Y, Z is an orthogonal frame
  double lx = X.Length();
  double ly = Y.Length();
  if ( lx <=  ON_SQRT_EPSILON )
    return false;
  if ( ly <=  ON_SQRT_EPSILON )
    return false;
  lx = 1.0/lx;
  ly = 1.0/ly;
  double x = ON_DotProduct( X, Y )*lx*ly;
  if ( fabs(x) >  ON_SQRT_EPSILON )
    return false;
  return true;
}